

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

string * __thiscall
cmCTestBuildHandler::GetMakeCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmCTestBuildHandler *this)

{
  cmCTest *pcVar1;
  ostream *poVar2;
  char *pcVar3;
  string *psVar4;
  ulong uVar5;
  allocator<char> local_251;
  string local_250;
  string local_230;
  string local_210 [8];
  string configType;
  undefined1 local_1d0 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  cmCTestBuildHandler *local_18;
  cmCTestBuildHandler *this_local;
  string *makeCommand;
  
  local_19 = 0;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  local_18 = this;
  this_local = (cmCTestBuildHandler *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"MakeCommand",&local_41);
  cmCTest::GetCTestConfiguration(__return_storage_ptr__,pcVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  poVar2 = std::operator<<((ostream *)local_1d0,"MakeCommand:");
  poVar2 = std::operator<<(poVar2,(string *)__return_storage_ptr__);
  std::operator<<(poVar2,"\n");
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x110,pcVar3,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string((string *)(configType.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  psVar4 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  std::__cxx11::string::string(local_210,(string *)psVar4);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"DefaultCTestConfigurationType",&local_251);
    cmCTest::GetCTestConfiguration(&local_230,pcVar1,&local_250);
    std::__cxx11::string::operator=(local_210,(string *)&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    std::__cxx11::string::operator=(local_210,"Release");
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,"${CTEST_CONFIGURATION_TYPE}",pcVar3);
  local_19 = 1;
  std::__cxx11::string::~string(local_210);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestBuildHandler::GetMakeCommand()
{
  std::string makeCommand = this->CTest->GetCTestConfiguration("MakeCommand");
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "MakeCommand:" << makeCommand << "\n", this->Quiet);

  std::string configType = this->CTest->GetConfigType();
  if (configType.empty()) {
    configType =
      this->CTest->GetCTestConfiguration("DefaultCTestConfigurationType");
  }
  if (configType.empty()) {
    configType = "Release";
  }

  cmSystemTools::ReplaceString(makeCommand, "${CTEST_CONFIGURATION_TYPE}",
                               configType.c_str());

  return makeCommand;
}